

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlNodeAddContentLen(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  xmlNodePtr first;
  _xmlDoc *p_Var2;
  int iVar3;
  xmlChar *pxVar4;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar5;
  
  if (len < 1 || cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (XML_NOTATION_NODE < xVar1) {
    return;
  }
  if ((0x11f8U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    if ((0x802U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      return;
    }
    first = cur->last;
    p_Var2 = cur->doc;
    cur_00 = xmlNewTextLen(content,len);
    if (cur_00 == (xmlNodePtr)0x0) {
      return;
    }
    cur_00->doc = p_Var2;
    pxVar5 = xmlAddChild(cur,cur_00);
    if (first == (xmlNodePtr)0x0 || pxVar5 != cur_00) {
      return;
    }
    if (first->next != cur_00) {
      return;
    }
    xmlTextMerge(first,cur_00);
    return;
  }
  if (content == (xmlChar *)0x0) {
    return;
  }
  pxVar4 = cur->content;
  if ((_xmlAttr **)pxVar4 == &cur->properties) {
LAB_0018619f:
    pxVar4 = xmlStrncatNew(pxVar4,content,len);
    cur->content = pxVar4;
    cur->properties = (_xmlAttr *)0x0;
  }
  else {
    if ((cur->doc != (_xmlDoc *)0x0) && (dict = cur->doc->dict, dict != (xmlDictPtr)0x0)) {
      iVar3 = xmlDictOwns(dict,pxVar4);
      pxVar4 = cur->content;
      if (iVar3 != 0) goto LAB_0018619f;
    }
    pxVar4 = xmlStrncat(pxVar4,content,len);
    cur->content = pxVar4;
  }
  return;
}

Assistant:

void
xmlNodeAddContentLen(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeAddContentLen : node == NULL\n");
#endif
	return;
    }
    if (len <= 0) return;
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE: {
	    xmlNodePtr last, newNode, tmp;

	    last = cur->last;
	    newNode = xmlNewDocTextLen(cur->doc, content, len);
	    if (newNode != NULL) {
		tmp = xmlAddChild(cur, newNode);
		if (tmp != newNode)
		    return;
	        if ((last != NULL) && (last->next == newNode)) {
		    xmlTextMerge(last, newNode);
		}
	    }
	    break;
	}
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_NOTATION_NODE:
	    if (content != NULL) {
	        if ((cur->content == (xmlChar *) &(cur->properties)) ||
		    ((cur->doc != NULL) && (cur->doc->dict != NULL) &&
			    xmlDictOwns(cur->doc->dict, cur->content))) {
		    cur->content = xmlStrncatNew(cur->content, content, len);
		    cur->properties = NULL;
		} else {
		    cur->content = xmlStrncat(cur->content, content, len);
                }
            }
	    break;
        case XML_DOCUMENT_NODE:
        case XML_DTD_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	    break;
    }
}